

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_seb(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGTemp *local_18;
  TCGv_i64 local_10;
  TCGv_i64 local_8;
  
  tcg_ctx = s->uc->tcg_ctx;
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = o->in1 + (long)tcg_ctx;
  local_8 = o->in2 + (long)tcg_ctx;
  tcg_gen_callN_s390x(tcg_ctx,helper_seb,(TCGTemp *)(o->out + (long)tcg_ctx),3,&local_18);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_seb(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_helper_seb(tcg_ctx, o->out, tcg_ctx->cpu_env, o->in1, o->in2);
    return DISAS_NEXT;
}